

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_posfix(FuncState *fs,BinOpr op,expdesc *e1,expdesc *e2,int line)

{
  int iVar1;
  int line_local;
  expdesc *e2_local;
  expdesc *e1_local;
  BinOpr op_local;
  FuncState *fs_local;
  
  switch(op) {
  case OPR_ADD:
  case OPR_SUB:
  case OPR_MUL:
  case OPR_MOD:
  case OPR_POW:
  case OPR_DIV:
  case OPR_IDIV:
  case OPR_BAND:
  case OPR_BOR:
  case OPR_BXOR:
  case OPR_SHL:
  case OPR_SHR:
    iVar1 = constfolding(fs,op,e1,e2);
    if (iVar1 == 0) {
      codebinexpval(fs,op + OPR_EQ,e1,e2,line);
    }
    break;
  case OPR_CONCAT:
    luaK_exp2val(fs,e2);
    if ((e2->k == VRELOCABLE) && ((fs->f->code[(e2->u).info] & 0xff) == 0x1d)) {
      if ((e1->u).info != (fs->f->code[(e2->u).info] >> 0x18) - 1) {
        __assert_fail("e1->u.info == ((int)((((fs)->f->code[(e2)->u.info]))>>24))-1",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                      ,0x6be,"void luaK_posfix(FuncState *, BinOpr, expdesc *, expdesc *, int)");
      }
      freeexp(fs,e1);
      *(char *)((long)fs->f->code + (long)(e2->u).info * 4 + 3) = (char)(e1->u).info;
      if ((ravi_parser_debug & 2U) != 0) {
        raviY_printf(fs,"[%d]* %o ; set A to %d\n",(ulong)(uint)(e2->u).info,
                     (ulong)fs->f->code[(e2->u).info],(ulong)(uint)(e1->u).info);
      }
      e1->k = VRELOCABLE;
      (e1->u).info = (e2->u).info;
      if ((e2->ravi_type_map == 0x100) && ((e1->ravi_type_map & 0xfffffee7) == 0)) {
        e1->ravi_type_map = 0x100;
      }
      else {
        e1->ravi_type_map = 0xffffffff;
      }
    }
    else {
      luaK_exp2nextreg(fs,e2);
      codebinexpval(fs,OP_CONCAT,e1,e2,line);
    }
    break;
  case OPR_EQ:
  case OPR_LT:
  case OPR_LE:
  case OPR_NE:
  case OPR_GT:
  case OPR_GE:
    codecomp(fs,op,e1,e2);
    break;
  case OPR_AND:
    if (e1->t != -1) {
      __assert_fail("e1->t == (-1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x69f,"void luaK_posfix(FuncState *, BinOpr, expdesc *, expdesc *, int)");
    }
    luaK_dischargevars(fs,e2);
    luaK_concat(fs,&e2->f,e1->f);
    if ((e1->ravi_type_map & 0xfffffffc) == 0) {
      e2->ravi_type_map = e1->ravi_type_map & 3;
    }
    else {
      e2->ravi_type_map = e1->ravi_type_map & 3 | e2->ravi_type_map;
    }
    memcpy(e1,e2,0x38);
    break;
  case OPR_OR:
    if (e1->f != -1) {
      __assert_fail("e1->f == (-1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x6ab,"void luaK_posfix(FuncState *, BinOpr, expdesc *, expdesc *, int)");
    }
    luaK_dischargevars(fs,e2);
    luaK_concat(fs,&e2->t,e1->t);
    if (((e1->ravi_type_map & e2->ravi_type_map & 0x400) != 0) && (e1->usertype != e2->usertype)) {
      e2->usertype = (TString *)0x0;
    }
    if ((e1->ravi_type_map & 3) == 0) {
      e2->ravi_type_map = e1->ravi_type_map & 0xfffffffc;
    }
    else {
      e2->ravi_type_map = e1->ravi_type_map & 0xfffffffc | e2->ravi_type_map;
    }
    memcpy(e1,e2,0x38);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                  ,0x6de,"void luaK_posfix(FuncState *, BinOpr, expdesc *, expdesc *, int)");
  }
  return;
}

Assistant:

void luaK_posfix (FuncState *fs, BinOpr op,
                  expdesc *e1, expdesc *e2, int line) {
  switch (op) {
    case OPR_AND: {
      lua_assert(e1->t == NO_JUMP);  /* list closed by 'luK_infix' */
      luaK_dischargevars(fs, e2);
      luaK_concat(fs, &e2->f, e1->f);
      if (e1->ravi_type_map & RAVI_TM_TRUISH) {
        e2->ravi_type_map |= e1->ravi_type_map & RAVI_TM_FALSISH;
      } else {
        e2->ravi_type_map = e1->ravi_type_map & RAVI_TM_FALSISH;
      }
      *e1 = *e2;
      break;
    }
    case OPR_OR: {
      lua_assert(e1->f == NO_JUMP);  /* list closed by 'luK_infix' */
      luaK_dischargevars(fs, e2);
      luaK_concat(fs, &e2->t, e1->t);
      if (e1->ravi_type_map & e2->ravi_type_map & RAVI_TM_USERDATA) {
        if (e1->usertype != e2->usertype)
          e2->usertype = NULL;
      }
      if (e1->ravi_type_map & RAVI_TM_FALSISH) {
        e2->ravi_type_map |= e1->ravi_type_map & RAVI_TM_TRUISH;
      } else {
        e2->ravi_type_map = e1->ravi_type_map & RAVI_TM_TRUISH;
      }
      *e1 = *e2;
      break;
    }
    case OPR_CONCAT: {
      luaK_exp2val(fs, e2);
      if (e2->k == VRELOCABLE &&
          GET_OPCODE(getinstruction(fs, e2)) == OP_CONCAT) {
        lua_assert(e1->u.info == GETARG_B(getinstruction(fs, e2))-1);
        freeexp(fs, e1);
        SETARG_B(getinstruction(fs, e2), e1->u.info);
        DEBUG_CODEGEN(raviY_printf(fs, "[%d]* %o ; set A to %d\n", e2->u.info, getinstruction(fs,e2), e1->u.info));
        e1->k = VRELOCABLE; e1->u.info = e2->u.info;
        if (e2->ravi_type_map == RAVI_TM_STRING &&
            (e1->ravi_type_map & (~(RAVI_TM_STRING | RAVI_TM_INTEGER | RAVI_TM_FLOAT))) == 0) {
          e1->ravi_type_map = RAVI_TM_STRING;
        }
        else {
          e1->ravi_type_map = RAVI_TM_ANY;
        }
      }
      else {
        luaK_exp2nextreg(fs, e2);  /* operand must be on the 'stack' */
        codebinexpval(fs, OP_CONCAT, e1, e2, line);
      }
      break;
    }
    case OPR_ADD: case OPR_SUB: case OPR_MUL: case OPR_DIV:
    case OPR_IDIV: case OPR_MOD: case OPR_POW:
    case OPR_BAND: case OPR_BOR: case OPR_BXOR:
    case OPR_SHL: case OPR_SHR: {
      if (!constfolding(fs, op + LUA_OPADD, e1, e2))
        codebinexpval(fs, cast(OpCode, op + OP_ADD), e1, e2, line);
      break;
    }
    case OPR_EQ: case OPR_LT: case OPR_LE:
    case OPR_NE: case OPR_GT: case OPR_GE: {
      codecomp(fs, op, e1, e2);
      break;
    }
    default: lua_assert(0);
  }
}